

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void NOPN2_DoIO(ym3438_t *chip)

{
  Bit8u BVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  
  chip->write_a_en = (chip->write_a & 3) == 1;
  bVar4 = (chip->write_d & 3) == 1;
  chip->write_d_en = bVar4;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  BVar1 = chip->write_busy;
  chip->busy = BVar1;
  bVar2 = chip->write_busy_cnt + BVar1;
  bVar3 = bVar2 < 0x20 || bVar4;
  if (BVar1 == '\0') {
    bVar3 = bVar4;
  }
  chip->write_busy = bVar3;
  chip->write_busy_cnt = bVar2 & 0x1f;
  return;
}

Assistant:

void NOPN2_DoIO(ym3438_t *chip)
{
    /* Write signal check */
    chip->write_a_en = (chip->write_a & 0x03) == 0x01;
    chip->write_d_en = (chip->write_d & 0x03) == 0x01;
    chip->write_a <<= 1;
    chip->write_d <<= 1;
    /* Busy counter */
    chip->busy = chip->write_busy;
    chip->write_busy_cnt += chip->write_busy;
    chip->write_busy = (chip->write_busy && !(chip->write_busy_cnt >> 5)) || chip->write_d_en;
    chip->write_busy_cnt &= 0x1f;
}